

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_histogram_converter_impl.h
# Opt level: O2

void __thiscall
label_histogram_converter::Converter<label::StringLabel>::create_label_histrogram
          (Converter<label::StringLabel> *this,Node<label::StringLabel> *tree_node,
          unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *label_histogram,int *tree_size)

{
  unordered_map<label::StringLabel,_int,_label_histogram_converter::Converter<label::StringLabel>::labelhash,_std::equal_to<label::StringLabel>,_std::allocator<std::pair<const_label::StringLabel,_int>_>_>
  *this_00;
  int iVar1;
  pointer pNVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_> *__range2
  ;
  Node<label::StringLabel> *child;
  pointer tree_node_00;
  StringLabel key;
  string label_str;
  key_type local_70;
  string local_50 [32];
  
  pNVar2 = (tree_node->children_).
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (tree_node_00 = (tree_node->children_).
                      super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; tree_node_00 != pNVar2;
      tree_node_00 = tree_node_00 + 1) {
    create_label_histrogram(this,tree_node_00,label_histogram,tree_size);
  }
  std::__cxx11::string::string((string *)&local_70,(string *)&tree_node->label_);
  std::__cxx11::string::string(local_50,(string *)&tree_node->label_);
  this_00 = &this->label_id_map_;
  iVar3 = std::
          _Hashtable<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_label_histogram_converter::Converter<label::StringLabel>::labelhash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,&local_70);
  if (iVar3.super__Node_iterator_base<std::pair<const_label::StringLabel,_int>,_true>._M_cur ==
      (__node_type *)0x0) {
    iVar1 = this->label_id_;
    this->label_id_ = iVar1 + 1;
    pmVar4 = std::__detail::
             _Map_base<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_label_histogram_converter::Converter<label::StringLabel>::labelhash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_label_histogram_converter::Converter<label::StringLabel>::labelhash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,&local_70);
    *pmVar4 = iVar1;
  }
  pmVar4 = std::__detail::
           _Map_base<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_label_histogram_converter::Converter<label::StringLabel>::labelhash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_label_histogram_converter::Converter<label::StringLabel>::labelhash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,&local_70);
  pmVar5 = std::__detail::
           _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)label_histogram,pmVar4);
  *pmVar5 = *pmVar5 + 1;
  *tree_size = *tree_size + 1;
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void Converter<Label>::create_label_histrogram(
    const node::Node<Label>& tree_node, 
    std::unordered_map<int, int>& label_histogram, 
    int& tree_size) {

  // do recursively for all children
  for (const auto& child: tree_node.get_children()) {
    create_label_histrogram(child, label_histogram, tree_size);
  }

  Label key = tree_node.label();
  std::string label_str = tree_node.label().to_string();

  // lookup key in token_map
  typename std::unordered_map<Label, int, labelhash>::const_iterator 
                              label_in_map = label_id_map_.find(key);
  // if label not in map
  if(label_in_map == label_id_map_.end())
    // add label id to map
    label_id_map_[key] = label_id_++;

  // increase label count for current node
  ++label_histogram[label_id_map_[key]];
  // increase tree size
  ++tree_size;
}